

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_unittest.cpp
# Opt level: O1

void __thiscall MyClass::MyClass(MyClass *this)

{
  ostream *poVar1;
  
  this->val_ = -99;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"MyClass DEFAULT CONSTRUCTOR: ",0x1d);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->val_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," this: ",7);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

MyClass () {
        std::cerr << "MyClass DEFAULT CONSTRUCTOR: " << val_ << " this: " << this <<  std::endl;
        //  = default;  TODO: We should not need this
    }